

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

token * dmrC_preprocess(dmr_C *C,token *token)

{
  token *local_18;
  token *token_local;
  dmr_C *C_local;
  
  C->preprocessing = 1;
  local_18 = token;
  token_local = (token *)C;
  init_preprocessor(C);
  do_preprocess((dmr_C *)token_local,&local_18);
  *(undefined4 *)((long)&token_local[0x24].field_2 + 4) = 0;
  return local_18;
}

Assistant:

struct token * dmrC_preprocess(struct dmr_C *C, struct token *token)
{
	C->preprocessing = 1;
	init_preprocessor(C);
	do_preprocess(C, &token);

	// Drop all expressions from preprocessing, they're not used any more.
	// This is not true when we have multiple files, though ;/
	// clear_expression_alloc();
	C->preprocessing = 0;

	return token;
}